

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void helics::arrayPairProcess
               (value *doc,string *key,
               function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *pairOp)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  bool bVar1;
  array_type *paVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  this;
  basic_value<toml::type_config> *in_RDX;
  size_t in_RDI;
  __sv_type _Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>
  *val_1;
  iterator __end3_1;
  iterator __begin3_1;
  table_type *__range3_1;
  basic_value<toml::type_config> *val;
  iterator __end3;
  iterator __begin3;
  array_type *__range3;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *info;
  string *in_stack_000000f8;
  value *in_stack_00000100;
  key_type *in_stack_ffffffffffffff48;
  basic_value<toml::type_config> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *pcVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  in_stack_ffffffffffffff90;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_30;
  array_type *local_28;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_20;
  basic_value<toml::type_config> *local_18;
  
  local_18 = in_RDX;
  bVar1 = fileops::isMember(in_stack_00000100,in_stack_000000f8);
  if (bVar1) {
    local_20 = toml::find<toml::type_config>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x3528a1);
    if (bVar1) {
      local_28 = toml::basic_value<toml::type_config>::as_array
                           ((basic_value<toml::type_config> *)in_stack_ffffffffffffff90._M_cur);
      local_30._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_ffffffffffffff48);
      std::
      vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
      ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             *)in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::
                     operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffff50,
                                (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator*(&local_30);
        in_stack_ffffffffffffff50 = local_18;
        paVar2 = toml::basic_value<toml::type_config>::as_array
                           ((basic_value<toml::type_config> *)in_stack_ffffffffffffff90._M_cur);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar2,0);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                  ((basic_value<toml::type_config> *)in_stack_ffffffffffffff90._M_cur);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        paVar2 = toml::basic_value<toml::type_config>::as_array
                           ((basic_value<toml::type_config> *)in_stack_ffffffffffffff90._M_cur);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar2,1);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                  ((basic_value<toml::type_config> *)in_stack_ffffffffffffff90._M_cur);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        __args._M_str = in_stack_ffffffffffffff70;
        __args._M_len = in_stack_ffffffffffffff68;
        __args_1._M_str = in_stack_ffffffffffffff60;
        __args_1._M_len = in_RDI;
        std::
        function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_ffffffffffffff50,__args,__args_1);
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(&local_30);
      }
    }
    else {
      toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                ((basic_value<toml::type_config> *)in_stack_ffffffffffffff90._M_cur);
      this._M_cur = (__node_type *)
                    std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                             *)in_stack_ffffffffffffff48);
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                  *)in_stack_ffffffffffffff48);
      while (bVar1 = std::__detail::operator==
                               ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                 *)&stack0xffffffffffffff90,&local_78), ((bVar1 ^ 0xffU) & 1) != 0)
      {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                     *)0x352a0f);
        _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff50);
        pcVar4 = (char *)_Var3._M_len;
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                  ((basic_value<toml::type_config> *)this._M_cur);
        _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff50);
        __args_00._M_str = pcVar4;
        __args_00._M_len = (size_t)_Var3._M_str;
        __args_1_00._M_str = (char *)_Var3._M_len;
        __args_1_00._M_len = in_RDI;
        std::
        function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_ffffffffffffff50,__args_00,__args_1_00);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                      *)in_stack_ffffffffffffff50);
      }
    }
  }
  return;
}

Assistant:

static void arrayPairProcess(toml::value doc,
                             const std::string& key,
                             const std::function<void(std::string_view, std::string_view)>& pairOp)
{
    using fileops::isMember;
    if (isMember(doc, key)) {
        auto& info = toml::find(doc, key);
        if (info.is_array()) {
            for (auto& val : info.as_array()) {
                pairOp(static_cast<std::string_view>(val.as_array()[0].as_string()),
                       static_cast<std::string_view>(val.as_array()[1].as_string()));
            }
        } else {
            for (const auto& val : info.as_table()) {
                pairOp(val.first, static_cast<std::string_view>(val.second.as_string()));
            }
        }
    }
}